

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O0

void __thiscall server::collectservmode::update(collectservmode *this)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  token local_5c;
  token *local_30;
  token *t;
  undefined1 local_20 [4];
  int i;
  vector<int> resets;
  collectservmode *this_local;
  
  if ((gamemillis < gamelimit) && ((this->notgotbases & 1U) == 0)) {
    resets._8_8_ = this;
    vector<int>::vector((vector<int> *)local_20);
    t._4_4_ = vector<server::collectservmode::token>::length(&this->tokens);
    while (t._4_4_ = t._4_4_ + -1, -1 < t._4_4_) {
      local_30 = vector<server::collectservmode::token>::operator[](&this->tokens,t._4_4_);
      if (9999 < lastmillis - local_30->droptime) {
        vector<int>::add((vector<int> *)local_20,&local_30->id);
        vector<server::collectservmode::token>::removeunordered(&local_5c,&this->tokens,t._4_4_);
      }
    }
    iVar1 = vector<int>::length((vector<int> *)local_20);
    if (iVar1 != 0) {
      uVar2 = vector<int>::length((vector<int> *)local_20);
      piVar3 = vector<int>::getbuf((vector<int> *)local_20);
      sendf(-1,1,"rivi",0x6d,(ulong)uVar2,piVar3,0xffffffff);
    }
    vector<int>::~vector((vector<int> *)local_20);
  }
  return;
}

Assistant:

void update()
    {
        if(gamemillis>=gamelimit || notgotbases) return;
        vector<int> resets;
        loopvrev(tokens)
        {
            token &t = tokens[i];
            if(lastmillis - t.droptime >= EXPIRETOKENTIME)
            {
                resets.add(t.id);
                tokens.removeunordered(i);
            }
        }
        if(resets.length())
            sendf(-1, 1, "rivi", N_EXPIRETOKENS, resets.length(), resets.getbuf(), -1);
    }